

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

int Gia_ManLutLevel(Gia_Man_t *p,int **ppLevels)

{
  int iVar1;
  int iVar2;
  int *__ptr;
  int *piVar3;
  bool bVar4;
  int LevelFan;
  int *pLevels;
  int Level;
  int iFan;
  int k;
  int i;
  Gia_Obj_t *pObj;
  int **ppLevels_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  __ptr = (int *)calloc((long)iVar1,4);
  for (iFan = 1; iVar1 = Gia_ManObjNum(p), iFan < iVar1; iFan = iFan + 1) {
    iVar1 = Gia_ObjIsLut(p,iFan);
    if (iVar1 != 0) {
      pLevels._0_4_ = 0;
      for (Level = 0; iVar1 = Gia_ObjLutSize(p,iFan), Level < iVar1; Level = Level + 1) {
        piVar3 = Gia_ObjLutFanins(p,iFan);
        if ((int)pLevels < __ptr[piVar3[Level]]) {
          pLevels._0_4_ = __ptr[piVar3[Level]];
        }
      }
      __ptr[iFan] = (int)pLevels + 1;
    }
  }
  pLevels._0_4_ = 0;
  Level = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar4 = false;
    if (Level < iVar1) {
      _k = Gia_ManCo(p,Level);
      bVar4 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjFaninId0p(p,_k);
    iVar1 = __ptr[iVar1];
    pLevels._0_4_ = Abc_MaxInt((int)pLevels,iVar1);
    iVar2 = Gia_ObjId(p,_k);
    __ptr[iVar2] = iVar1;
    Level = Level + 1;
  }
  if (ppLevels == (int **)0x0) {
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
  }
  else {
    *ppLevels = __ptr;
  }
  return (int)pLevels;
}

Assistant:

int Gia_ManLutLevel( Gia_Man_t * p, int ** ppLevels )
{
    Gia_Obj_t * pObj;
    int i, k, iFan, Level;
    int * pLevels = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachLut( p, i )
    {
        Level = 0;
        Gia_LutForEachFanin( p, i, iFan, k )
            if ( Level < pLevels[iFan] )
                Level = pLevels[iFan];
        pLevels[i] = Level + 1;
    }
    Level = 0;
    Gia_ManForEachCo( p, pObj, k )
    {
        int LevelFan = pLevels[Gia_ObjFaninId0p(p, pObj)];
        Level = Abc_MaxInt( Level, LevelFan );
        pLevels[Gia_ObjId(p, pObj)] = LevelFan;
    }
    if ( ppLevels )
        *ppLevels = pLevels;
    else
        ABC_FREE( pLevels );
    return Level;
}